

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckTemplate.cxx
# Opt level: O1

bool __thiscall kws::Parser::CheckTemplate(Parser *this,char *regEx)

{
  string *psVar1;
  char cVar2;
  pointer pcVar3;
  ulong uVar4;
  ulong pos;
  size_t sVar5;
  long *plVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  long *plVar8;
  ulong uVar9;
  bool bVar10;
  byte bVar11;
  ulong uVar12;
  int iVar13;
  bool bVar14;
  string currentWord;
  Error error;
  RegularExpression regex;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  undefined8 local_2e0;
  undefined1 local_2d8 [24];
  _Alloc_hider local_2c0;
  size_type local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0;
  long *local_2a0;
  long local_298;
  long local_290;
  long lStack_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  RegularExpression local_260;
  
  this->m_TestsDone[0x16] = true;
  std::__cxx11::string::_M_replace
            ((ulong)(this->m_TestsDescription + 0x16),0,
             (char *)this->m_TestsDescription[0x16]._M_string_length,0x178a3c);
  std::__cxx11::string::append((char *)(this->m_TestsDescription + 0x16));
  local_260.regmust = (char *)0x0;
  local_260.program = (char *)0x0;
  local_260.progsize = 0;
  memset(&local_260,0,0x20a);
  if (regEx != (char *)0x0) {
    kwssys::RegularExpression::compile(&local_260,regEx);
  }
  psVar1 = &this->m_BufferNoComment;
  uVar4 = std::__cxx11::string::find((char *)psVar1,0x178140,0);
  if (uVar4 == 0xffffffffffffffff) {
    bVar11 = 1;
  }
  else {
    local_2e0 = 0;
    do {
      pcVar3 = (psVar1->_M_dataplus)._M_p;
      cVar2 = pcVar3[uVar4 - 1];
      if ((cVar2 == ' ') || (cVar2 == '\n')) {
        cVar2 = pcVar3[uVar4 + 8];
        bVar10 = cVar2 == '\n' || cVar2 == ' ';
      }
      else {
        bVar10 = false;
      }
      pos = std::__cxx11::string::find((char *)psVar1,0x178498,uVar4);
      sVar5 = std::__cxx11::string::find((char *)psVar1,0x1779c2,pos);
      if (sVar5 == 0xffffffffffffffff || pos == 0xffffffffffffffff) {
LAB_00156052:
        uVar4 = std::__cxx11::string::find((char *)psVar1,0x178140,uVar4 + 1);
      }
      else {
        uVar12 = uVar4 + 8;
        if ((long)uVar12 < (long)pos) {
          do {
            uVar9 = (ulong)(byte)(psVar1->_M_dataplus)._M_p[uVar12];
            if ((0x20 < uVar9) || ((0x100002400U >> (uVar9 & 0x3f) & 1) == 0)) goto LAB_00156052;
            uVar12 = uVar12 + 1;
          } while (pos != uVar12);
        }
        if (!bVar10) goto LAB_00156052;
        local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_300);
        if ((long)pos < (long)sVar5) {
          iVar13 = 0;
          bVar10 = false;
          bVar14 = false;
          do {
            pos = pos + 1;
            bVar11 = (psVar1->_M_dataplus)._M_p[pos];
            iVar13 = (uint)(bVar11 == 0x3c) + iVar13;
            if (bVar11 - 0x3d < 2) {
LAB_00155e4e:
              if (((char *)local_300._M_string_length != (char *)0x0) && (!bVar10)) {
                bVar10 = kwssys::RegularExpression::find
                                   (&local_260,local_300._M_dataplus._M_p,&local_260.regmatch);
                if (!bVar10 && iVar13 == 0) {
                  local_2c0._M_p = (pointer)&local_2b0;
                  local_2b8 = 0;
                  local_2b0._M_local_buf[0] = '\0';
                  local_2d8._0_8_ = GetLineNumber(this,pos,true);
                  local_2d8._16_8_ = 0x16;
                  local_2d8._8_8_ = local_2d8._0_8_;
                  std::operator+(&local_280,"Template definition (",&local_300);
                  plVar6 = (long *)std::__cxx11::string::append((char *)&local_280);
                  plVar8 = plVar6 + 2;
                  if ((long *)*plVar6 == plVar8) {
                    local_290 = *plVar8;
                    lStack_288 = plVar6[3];
                    local_2a0 = &local_290;
                  }
                  else {
                    local_290 = *plVar8;
                    local_2a0 = (long *)*plVar6;
                  }
                  local_298 = plVar6[1];
                  *plVar6 = (long)plVar8;
                  plVar6[1] = 0;
                  *(undefined1 *)(plVar6 + 2) = 0;
                  std::__cxx11::string::operator=((string *)&local_2c0,(string *)&local_2a0);
                  if (local_2a0 != &local_290) {
                    operator_delete(local_2a0);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_280._M_dataplus._M_p != &local_280.field_2) {
                    operator_delete(local_280._M_dataplus._M_p);
                  }
                  std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                            (&this->m_ErrorList,(value_type *)local_2d8);
                  paVar7 = &local_2b0;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2c0._M_p != paVar7) {
                    operator_delete(local_2c0._M_p);
                    paVar7 = extraout_RAX;
                  }
                  local_2e0 = CONCAT71((int7)((ulong)paVar7 >> 8),1);
                }
              }
              bVar10 = (psVar1->_M_dataplus)._M_p[pos] == '=';
LAB_00155ff2:
              bVar14 = false;
            }
            else {
              if (bVar11 == 0x20) goto LAB_00155ff2;
              if (bVar11 == 0x2c) goto LAB_00155e4e;
              if (!bVar14) {
                std::__cxx11::string::_M_replace
                          ((ulong)&local_300,0,(char *)local_300._M_string_length,0x16b513);
              }
              bVar14 = true;
              std::__cxx11::string::push_back('\0');
            }
            iVar13 = iVar13 - (uint)((psVar1->_M_dataplus)._M_p[pos] == '>');
          } while (pos != sVar5);
        }
        uVar4 = std::__cxx11::string::find((char *)psVar1,0x178140,uVar4 + 1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_300._M_dataplus._M_p != &local_300.field_2) {
          operator_delete(local_300._M_dataplus._M_p);
        }
      }
    } while (uVar4 != 0xffffffffffffffff);
    bVar11 = (byte)local_2e0 ^ 1;
  }
  if (local_260.program != (char *)0x0) {
    operator_delete__(local_260.program);
  }
  return (bool)(bVar11 & 1);
}

Assistant:

bool Parser::CheckTemplate(const char* regEx)
{
  m_TestsDone[TEMPLATE] = true;
  m_TestsDescription[TEMPLATE] = "Template should match the regex: ";
  m_TestsDescription[TEMPLATE] += regEx;

  kwssys::RegularExpression regex(regEx);

  bool hasErrors = false;
  // We check all the templates in the file
  // Maybe we should separate the main class from the templated function
  // at some point.

  auto templatePos =
      static_cast<long int>(m_BufferNoComment.find("template", 0));
  while(templatePos != -1 ) 
    {
    bool valid = true;

    if(m_BufferNoComment[templatePos-1]!=' ' 
      && m_BufferNoComment[templatePos-1]!='\n')
      {
      valid = false;
      }
    else if(m_BufferNoComment[templatePos+8]!=' ' 
         && m_BufferNoComment[templatePos+8]!='\n')
      {
      valid = false;
      }

    // Definition is template <whatever name,whatever name2 = test, ...>
      auto inf =
          static_cast<long int>(m_BufferNoComment.find("<", templatePos));
      auto sup = static_cast<long int>(m_BufferNoComment.find(">", inf));

      if (inf == -1 || sup == -1) {
        // std::cout << "CheckTemplate(): There is a problem parsing the file"
        // << std::endl;
        valid = false;
      }
    else
      {
      for(long int p=templatePos+8;p<inf;p++)
        {
        if(m_BufferNoComment[p]!=' ' && m_BufferNoComment[p]!='\n'
           && m_BufferNoComment[p]!='\r')
          {
          valid = false;
          break;
          }
        }
      }



    if(!valid)
      {
      templatePos = static_cast<long int>(m_BufferNoComment.find("template",templatePos+1));
      continue;
      }

    long int i = inf+1;
    bool inWord = false;
    bool afterEqual = false;
    int level = 0;
    std::string currentWord = "";

    while(i<=sup)
      {
      if(m_BufferNoComment[i] == '<')
        {
        level++;
        }

      // If we have a space
      if(m_BufferNoComment[i] == ' ')
        {
        // do nothing
        inWord = false;
        }
      else if(m_BufferNoComment[i] == ',' || m_BufferNoComment[i] == '>' || m_BufferNoComment[i] == '=')
        {
        inWord = false;

        if (!currentWord.empty() && !afterEqual && !regex.find(currentWord) &&
            level == 0) {
          Error error;
          error.line = this->GetLineNumber(i,true);
          error.line2 = error.line;
          error.number = TEMPLATE;
          error.description = "Template definition (" + currentWord + ") doesn't match regular expression";
          m_ErrorList.push_back(error);
          hasErrors = true;
        }

        if(m_BufferNoComment[i] == '=')
          {
          afterEqual = true;
          }
        else
          {
          afterEqual = false;
          }
        }
      else
        {
        if(!inWord)
          {
          currentWord = "";
          }
        currentWord += m_BufferNoComment[i];
        inWord = true;
        }

       if(m_BufferNoComment[i] == '>')
        {
        level--;
        }
      i++;
      }

    templatePos = static_cast<long int>(m_BufferNoComment.find("template",templatePos+1));  
    }

  return !hasErrors;
}